

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::xr_surfmap*,std::allocator<xray_re::xr_surfmap*>>,write_surfmap>
          (xr_writer *this,
          vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_> *container)

{
  bool bVar1;
  reference ppxVar2;
  __normal_iterator<xray_re::xr_surfmap_*const_*,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::begin(container)
  ;
  local_30._M_current =
       (xr_surfmap **)
       std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    ppxVar2 = __gnu_cxx::
              __normal_iterator<xray_re::xr_surfmap_*const_*,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
              ::operator*(&end);
    write_surfmap::operator()((write_surfmap *)((long)&this_local + 7),*ppxVar2,this);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_surfmap_*const_*,_std::vector<xray_re::xr_surfmap_*,_std::allocator<xray_re::xr_surfmap_*>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}